

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

void __thiscall
GF2::MP<45UL,_GF2::MOGrlex<45UL>_>::Union(MP<45UL,_GF2::MOGrlex<45UL>_> *this,MM<45UL> *mRight)

{
  bool bVar1;
  iterator iVar2;
  iterator __position;
  undefined8 in_RSI;
  list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *in_RDI;
  iterator iter;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 uVar3;
  _List_const_iterator<GF2::MM<45UL>_> local_40;
  list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *in_stack_ffffffffffffffd0;
  _Self local_18;
  undefined8 local_10;
  
  local_10 = in_RSI;
  iVar2 = std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::begin(in_RDI);
  __position = std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::end(in_RDI);
  local_18._M_node =
       (_List_node_base *)
       std::lower_bound<std::_List_iterator<GF2::MM<45ul>>,GF2::MM<45ul>,GF2::MOGrlex<45ul>>
                 (iVar2._M_node,__position._M_node,local_10);
  iVar2 = std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::end(in_RDI);
  bVar1 = std::operator==(&local_18,(_Self *)&stack0xffffffffffffffc8);
  uVar3 = true;
  if (!bVar1) {
    std::_List_iterator<GF2::MM<45UL>_>::operator*
              ((_List_iterator<GF2::MM<45UL>_> *)CONCAT17(1,in_stack_ffffffffffffffb0));
    uVar3 = WW<45ul>::operator!=
                      ((WW<45UL> *)CONCAT17(uVar3,in_stack_ffffffffffffffb0),(WW<45UL> *)in_RDI);
  }
  if ((bool)uVar3 != false) {
    std::_List_const_iterator<GF2::MM<45UL>_>::_List_const_iterator(&local_40,&local_18);
    std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::insert
              (in_stack_ffffffffffffffd0,(const_iterator)__position._M_node,
               (value_type *)iVar2._M_node);
  }
  return;
}

Assistant:

void Union(const MM<_n>& mRight)
	{	
		// находим первую позицию в списке, вставка в которую mRight 
		// не нарушит порядок
		iterator iter = std::lower_bound(begin(), end(), mRight, _order);
		// нет mRight?
		if (iter == end() || *iter != mRight)
			insert(iter, mRight);
	}